

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_json.c
# Opt level: O2

void json_add_double(json_t *json,char *key,double value)

{
  int iVar1;
  size_t len;
  undefined1 in_R8B;
  char buffer [512];
  
  json_check_comma(json);
  iVar1 = snprintf(buffer,0x200,"%f",value);
  if (key != (char *)0x0) {
    len = strlen(key);
    json_write_raw(json,key,len,true,(_Bool)in_R8B);
    json_write_raw(json,":",1,false,(_Bool)in_R8B);
  }
  json_write_raw(json,buffer,(long)iVar1,false,(_Bool)in_R8B);
  return;
}

Assistant:

void json_add_double (json_t *json, const char *key, double value) {
    json_check_comma(json);
    
    char buffer[512];
    // was %g but we don't like scientific notation nor the missing .0 in case of float number with no decimals
    size_t len = snprintf(buffer, sizeof(buffer), "%f", value);

    if (key) {
        json_write_raw (json, key, strlen(key), true, true);
        JSON_WRITE_COLUMN;
    }
    
    json_write_raw(json, buffer, len, false, (key == NULL));
}